

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.cpp
# Opt level: O0

void __thiscall
irr::video::CNullDriver::draw2DImage
          (CNullDriver *this,ITexture *texture,vector2d<int> *destPos,bool useAlphaChannelOfTexture)

{
  dimension2d<unsigned_int> *other;
  byte in_CL;
  undefined8 in_RDX;
  ITexture *in_RSI;
  long *in_RDI;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  rect<int> *in_stack_ffffffffffffffa0;
  SColor local_40;
  dimension2d<int> local_3c;
  vector2d<int> local_34;
  undefined1 local_2c [19];
  byte local_19;
  ITexture *local_10;
  
  local_19 = in_CL & 1;
  if (in_RSI != (ITexture *)0x0) {
    local_10 = in_RSI;
    core::vector2d<int>::vector2d(&local_34,0,0);
    other = ITexture::getOriginalSize(local_10);
    core::dimension2d<int>::dimension2d<unsigned_int>(&local_3c,other);
    core::rect<int>::rect<int>
              (in_stack_ffffffffffffffa0,
               (vector2d<int> *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
               (dimension2d<int> *)0x30aabf);
    SColor::SColor(&local_40,0xff,0xff,0xff,0xff);
    (**(code **)(*in_RDI + 0x180))(in_RDI,in_RSI,in_RDX,local_2c,0,local_40.color,local_19 & 1);
  }
  return;
}

Assistant:

void CNullDriver::draw2DImage(const video::ITexture *texture, const core::position2d<s32> &destPos, bool useAlphaChannelOfTexture)
{
	if (!texture)
		return;

	draw2DImage(texture, destPos, core::rect<s32>(core::position2d<s32>(0, 0), core::dimension2di(texture->getOriginalSize())),
			0,
			SColor(255, 255, 255, 255),
			useAlphaChannelOfTexture);
}